

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O0

void __thiscall GdlRule::FixGlyphAttrsInRules(GdlRule *this,GrcManager *pcman,GrcFont *pfont)

{
  byte bVar1;
  bool bVar2;
  reference ppGVar3;
  undefined8 in_RSI;
  GdlRule *in_RDI;
  GdlRuleItem *prit_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *__range1_2;
  int index;
  GdlRuleItem *prit_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *__range1_1;
  GdlGlyphClassDefn *pglfc;
  Symbol psymInput;
  GdlRuleItem *prit;
  iterator __end1;
  iterator __begin1;
  vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *__range1;
  vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> vpglfcInClasses;
  string *in_stack_fffffffffffffee8;
  GdlGlyphClassDefn *in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef8;
  byte in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  Symbol in_stack_ffffffffffffff00;
  undefined5 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0d;
  undefined1 in_stack_ffffffffffffff0e;
  byte in_stack_ffffffffffffff0f;
  __normal_iterator<GdlRuleItem_**,_std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>_>
  local_d8;
  vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *local_d0;
  int local_c4;
  GdlRuleItem *local_c0;
  GdlRuleItem **local_b8;
  __normal_iterator<GdlRuleItem_**,_std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>_>
  local_b0;
  vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *local_a8;
  undefined8 local_a0;
  GdlGlyphClassDefn *local_98;
  byte local_89;
  string local_88 [48];
  Symbol local_58;
  GdlRuleItem *local_50;
  GdlRuleItem **local_48;
  __normal_iterator<GdlRuleItem_**,_std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>_>
  local_40;
  vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *local_38;
  undefined1 local_30 [32];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::vector
            ((vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)0x146909);
  local_38 = &in_RDI->m_vprit;
  local_40._M_current =
       (GdlRuleItem **)
       std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::begin
                 ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)in_stack_fffffffffffffee8
                 );
  local_48 = (GdlRuleItem **)
             std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::end
                       ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)
                        in_stack_fffffffffffffee8);
  do {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<GdlRuleItem_**,_std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>_>
                        *)in_stack_fffffffffffffef0,
                       (__normal_iterator<GdlRuleItem_**,_std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>_>
                        *)in_stack_fffffffffffffee8);
    if (!bVar2) {
      local_a8 = &in_RDI->m_vprit;
      local_b0._M_current =
           (GdlRuleItem **)
           std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::begin
                     ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)
                      in_stack_fffffffffffffee8);
      local_b8 = (GdlRuleItem **)
                 std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::end
                           ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)
                            in_stack_fffffffffffffee8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<GdlRuleItem_**,_std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>_>
                                 *)in_stack_fffffffffffffef0,
                                (__normal_iterator<GdlRuleItem_**,_std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>_>
                                 *)in_stack_fffffffffffffee8), bVar2) {
        ppGVar3 = __gnu_cxx::
                  __normal_iterator<GdlRuleItem_**,_std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>_>
                  ::operator*(&local_b0);
        local_c0 = *ppGVar3;
        (*local_c0->_vptr_GdlRuleItem[0xb])(local_c0,local_10);
        __gnu_cxx::
        __normal_iterator<GdlRuleItem_**,_std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>_>
        ::operator++(&local_b0);
      }
      FixFeatureTestsInRules
                (in_RDI,(GrcFont *)
                        CONCAT17(in_stack_ffffffffffffff0f,
                                 CONCAT16(in_stack_ffffffffffffff0e,
                                          CONCAT15(in_stack_ffffffffffffff0d,
                                                   in_stack_ffffffffffffff08))));
      local_c4 = 0;
      local_d0 = &in_RDI->m_vprit;
      local_d8._M_current =
           (GdlRuleItem **)
           std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::begin
                     ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)
                      in_stack_fffffffffffffee8);
      std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::end
                ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)in_stack_fffffffffffffee8)
      ;
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<GdlRuleItem_**,_std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>_>
                                 *)in_stack_fffffffffffffef0,
                                (__normal_iterator<GdlRuleItem_**,_std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>_>
                                 *)in_stack_fffffffffffffee8), bVar2) {
        ppGVar3 = __gnu_cxx::
                  __normal_iterator<GdlRuleItem_**,_std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>_>
                  ::operator*(&local_d8);
        local_c4 = local_c4 + 1;
        (*(*ppGVar3)->_vptr_GdlRuleItem[10])(*ppGVar3,local_10,local_30,in_RDI);
        __gnu_cxx::
        __normal_iterator<GdlRuleItem_**,_std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>_>
        ::operator++(&local_d8);
      }
      std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::~vector
                ((vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)
                 in_stack_ffffffffffffff00);
      return;
    }
    ppGVar3 = __gnu_cxx::
              __normal_iterator<GdlRuleItem_**,_std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>_>
              ::operator*(&local_40);
    local_50 = *ppGVar3;
    local_58 = local_50->m_psymInput;
    local_89 = 0;
    bVar1 = 0;
    if (local_58 != (Symbol)0x0) {
      in_stack_ffffffffffffff0e =
           GrcSymbolTableEntry::FitsSymbolType
                     ((GrcSymbolTableEntry *)
                      CONCAT17(in_stack_fffffffffffffeff,
                               CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)),
                      (SymbolType)((ulong)in_stack_fffffffffffffef0 >> 0x20));
      if (!(bool)in_stack_ffffffffffffff0e) {
        in_stack_ffffffffffffff0d =
             GrcSymbolTableEntry::FitsSymbolType
                       ((GrcSymbolTableEntry *)
                        CONCAT17(in_stack_fffffffffffffeff,
                                 CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)),
                        (SymbolType)((ulong)in_stack_fffffffffffffef0 >> 0x20));
        bVar1 = 0;
        if (!(bool)in_stack_ffffffffffffff0d) goto LAB_00146a3f;
      }
      in_stack_ffffffffffffff00 = local_58;
      GdlGlyphClassDefn::Undefined_abi_cxx11_();
      local_89 = 1;
      in_stack_fffffffffffffeff =
           GrcSymbolTableEntry::LastFieldIs
                     ((GrcSymbolTableEntry *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      bVar1 = in_stack_fffffffffffffeff ^ 0xff;
    }
LAB_00146a3f:
    in_stack_fffffffffffffefe = bVar1;
    in_stack_ffffffffffffff0f = in_stack_fffffffffffffefe;
    if ((local_89 & 1) != 0) {
      std::__cxx11::string::~string(local_88);
    }
    if ((in_stack_fffffffffffffefe & 1) == 0) {
      local_a0 = 0;
      std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::push_back
                ((vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)
                 in_stack_fffffffffffffef0,(value_type *)in_stack_fffffffffffffee8);
    }
    else {
      in_stack_fffffffffffffef0 =
           GrcSymbolTableEntry::GlyphClassDefnData
                     ((GrcSymbolTableEntry *)
                      CONCAT17(in_stack_ffffffffffffff0f,
                               CONCAT16(in_stack_ffffffffffffff0e,
                                        CONCAT15(in_stack_ffffffffffffff0d,in_stack_ffffffffffffff08
                                                ))));
      local_98 = in_stack_fffffffffffffef0;
      std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::push_back
                ((vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)
                 in_stack_ffffffffffffff00,
                 (value_type *)
                 CONCAT17(in_stack_fffffffffffffeff,
                          CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
    }
    __gnu_cxx::
    __normal_iterator<GdlRuleItem_**,_std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>_>::
    operator++(&local_40);
  } while( true );
}

Assistant:

void GdlRule::FixGlyphAttrsInRules(GrcManager * pcman, GrcFont * pfont)
{
	//	Make a list of all the input-classes in the rule, for checking for the definition
	//	of glyph attributes in constraints and attribute-setters.
	std::vector<GdlGlyphClassDefn *> vpglfcInClasses;
	for (auto const prit: m_vprit)
	{
		Symbol psymInput = prit->m_psymInput;
		if (psymInput &&
			(psymInput->FitsSymbolType(ksymtClass) ||
				psymInput->FitsSymbolType(ksymtSpecialLb)) &&
				!psymInput->LastFieldIs(GdlGlyphClassDefn::Undefined()))
		{
			GdlGlyphClassDefn * pglfc = psymInput->GlyphClassDefnData();
			Assert(pglfc);
			vpglfcInClasses.push_back(pglfc);
		}
		else
			//	invalid input class
			vpglfcInClasses.push_back(NULL);
	}
	Assert(m_vprit.size() == vpglfcInClasses.size());

	//	Flatten slot attributes that use points to use integers instead. Do this
	//	entire process before fixing glyph attrs, because there can be some interaction between
	//	slots in a rule (eg, attach.to/at). So we can be sure at that point what state
	//	things are in.
	for (auto const prit: m_vprit)
	{
		prit->FlattenPointSlotAttrs(pcman);
	}

	//	While we're at it, fix the feature tests. Do this before fixing the glyph attributes,
	//	because it is possible to have feature tests embedded in conditional statements.
	FixFeatureTestsInRules(pfont);

	//	Now do the fixes, error checks, etc.
	auto index = 0;
	for (auto const prit: m_vprit)
	{
		prit->FixGlyphAttrsInRules(pcman, vpglfcInClasses, this, index++);
	}
}